

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CondResultTest.cpp
# Opt level: O3

void __thiscall CondResultTest::CondResultTest(CondResultTest *this)

{
  undefined1 local_d3;
  bool local_d2;
  bool local_d1;
  shared_ptr<const_oout::NamedTest> local_d0;
  shared_ptr<oout::CondResult> local_c0;
  shared_ptr<oout::CountFailure> local_b0;
  shared_ptr<CountFailureRepr> local_a0;
  shared_ptr<oout::EqualTest> local_90;
  shared_ptr<oout::CondResult> local_80;
  shared_ptr<oout::CountFailure> local_70;
  shared_ptr<CountFailureRepr> local_60;
  shared_ptr<oout::EqualTest> local_50;
  shared_ptr<const_oout::NamedTest> local_40;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"CondResult test","");
  local_d1 = true;
  local_80.super___shared_ptr<oout::CondResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::CondResult,std::allocator<oout::CondResult>,bool,char_const(&)[8]>
            (&local_80.super___shared_ptr<oout::CondResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CondResult **)&local_80,(allocator<oout::CondResult> *)&local_d0,&local_d1,
             (char (*) [8])0x17ca77);
  local_70.super___shared_ptr<oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::CountFailure,std::allocator<oout::CountFailure>,std::shared_ptr<oout::CondResult>>
            (&local_70.super___shared_ptr<oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CountFailure **)&local_70,(allocator<oout::CountFailure> *)&local_d0,
             &local_80);
  local_60.super___shared_ptr<CountFailureRepr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CountFailureRepr,std::allocator<CountFailureRepr>,std::shared_ptr<oout::CountFailure>>
            (&local_60.super___shared_ptr<CountFailureRepr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CountFailureRepr **)&local_60,(allocator<CountFailureRepr> *)&local_d0,&local_70);
  local_50.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::shared_ptr<CountFailureRepr>,char_const(&)[2]>
            (&local_50.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_50,(allocator<oout::EqualTest> *)&local_d0,&local_60,
             (char (*) [2])0x17ba77);
  local_40.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest_const,std::allocator<oout::NamedTest>,char_const(&)[34],std::shared_ptr<oout::EqualTest>>
            (&local_40.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NamedTest **)&local_40,(allocator<oout::NamedTest> *)&local_d0,
             (char (*) [34])"CondResult succes if cond is true",&local_50);
  local_d2 = false;
  local_c0.super___shared_ptr<oout::CondResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::CondResult,std::allocator<oout::CondResult>,bool,char_const(&)[8]>
            (&local_c0.super___shared_ptr<oout::CondResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CondResult **)&local_c0,(allocator<oout::CondResult> *)&local_d3,&local_d2,
             (char (*) [8])0x17cda4);
  local_b0.super___shared_ptr<oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::CountFailure,std::allocator<oout::CountFailure>,std::shared_ptr<oout::CondResult>>
            (&local_b0.super___shared_ptr<oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CountFailure **)&local_b0,(allocator<oout::CountFailure> *)&local_d3,
             &local_c0);
  local_a0.super___shared_ptr<CountFailureRepr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CountFailureRepr,std::allocator<CountFailureRepr>,std::shared_ptr<oout::CountFailure>>
            (&local_a0.super___shared_ptr<CountFailureRepr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CountFailureRepr **)&local_a0,(allocator<CountFailureRepr> *)&local_d3,&local_b0);
  local_90.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::shared_ptr<CountFailureRepr>,char_const(&)[2]>
            (&local_90.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_90,(allocator<oout::EqualTest> *)&local_d3,&local_a0,
             (char (*) [2])0x17d8ff);
  local_d0.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest_const,std::allocator<oout::NamedTest>,char_const(&)[36],std::shared_ptr<oout::EqualTest>>
            (&local_d0.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NamedTest **)&local_d0,(allocator<oout::NamedTest> *)&local_d3,
             (char (*) [36])"CondResult failure if cond is false",&local_90);
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_30,&local_40,&local_d0);
  if (local_d0.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_90.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_a0.super___shared_ptr<CountFailureRepr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<CountFailureRepr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_b0.super___shared_ptr<oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c0.super___shared_ptr<oout::CondResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<oout::CondResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_40.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_50.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_60.super___shared_ptr<CountFailureRepr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<CountFailureRepr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_70.super___shared_ptr<oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_80.super___shared_ptr<oout::CondResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<oout::CondResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_00196538;
  return;
}

Assistant:

CondResultTest::CondResultTest()
: dirty::Test(
	"CondResult test",
	make_shared<const NamedTest>(
		"CondResult succes if cond is true",
		make_shared<EqualTest>(
			make_shared<CountFailureRepr>(
				make_shared<CountFailure>(
					make_shared<CondResult>(true, "success")
				)
			),
			"0"
		)
	),
	make_shared<const NamedTest>(
		"CondResult failure if cond is false",
		make_shared<EqualTest>(
			make_shared<CountFailureRepr>(
				make_shared<CountFailure>(
					make_shared<CondResult>(false, "failure")
				)
			),
			"1"
		)
	)
)
{
}